

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::emit_wave_quad_vote_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Operation *this_00;
  Value *value;
  uint32_t vote_kind;
  uint32_t local_30;
  Capability local_2c;
  
  bVar1 = get_constant_operand(&instruction->super_Instruction,2,&local_30);
  if (bVar1) {
    if ((impl->options).supports_quad_control == true) {
      this = Converter::Impl::builder(impl);
      spv::Builder::addExtension(this,"SPV_KHR_quad_control");
      local_2c = CapabilityQuadControlKHR;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this->capabilities,&local_2c);
      this_00 = Converter::Impl::allocate
                          (impl,(local_30 == 0) + OpGroupNonUniformQuadAllKHR,(Value *)instruction);
    }
    else {
      IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,(local_30 == 0) + QuadAll,0);
      this_00 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction);
      Operation::add_id(this_00,IVar2);
    }
    value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(this_00,IVar2);
    Converter::Impl::add(impl,this_00,false);
    if (impl->execution_model == ExecutionModelFragment) {
      (impl->execution_mode_meta).needs_quad_derivatives = true;
    }
  }
  return bVar1;
}

Assistant:

bool emit_wave_quad_vote_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	uint32_t vote_kind;
	if (!get_constant_operand(instruction, 2, &vote_kind))
		return false;

	if (impl.options.supports_quad_control)
	{
		auto &builder = impl.builder();
		builder.addExtension("SPV_KHR_quad_control");
		builder.addCapability(spv::CapabilityQuadControlKHR);

		spv::Op opcode = vote_kind ? spv::OpGroupNonUniformQuadAllKHR : spv::OpGroupNonUniformQuadAnyKHR;

		auto *op = impl.allocate(opcode, instruction);
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(op);
	}
	else
	{
		// All lanes must be active according to SM 6.7 (and backed up by tests), so quadBroadcast
		// pattern is valid and can be optimized by compilers into the intrinsic short form.
		spv::Id call_id = impl.spirv_module.get_helper_call_id(vote_kind ? HelperCall::QuadAll : HelperCall::QuadAny);

		auto *op = impl.allocate(spv::OpFunctionCall, instruction);
		op->add_id(call_id);
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(op);
	}

	if (impl.execution_model == spv::ExecutionModelFragment)
		impl.execution_mode_meta.needs_quad_derivatives = true;

	return true;
}